

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<int,char_const(&)[2],unsigned_int,char_const(&)[2],long,char_const(&)[2],long_long>
          (StringTree *__return_storage_ptr__,kj *this,int *params,char (*params_1) [2],
          uint *params_2,char (*params_3) [2],long *params_4,char (*params_5) [2],longlong *params_6
          )

{
  CappedArray<char,_26UL> *in_stack_ffffffffffffff18;
  CappedArray<char,_14UL> local_e0;
  undefined1 local_c8 [24];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [56];
  CappedArray<char,_26UL> local_58;
  
  toCharSequence<int>((CappedArray<char,_14UL> *)local_c8,(int *)this);
  local_90._0_16_ = (undefined1  [16])toCharSequence<char_const(&)[2]>((char (*) [2])params);
  toCharSequence<unsigned_int>(&local_e0,(uint *)params_1);
  local_a0 = (undefined1  [16])toCharSequence<char_const(&)[2]>((char (*) [2])params_2);
  toCharSequence<long>(&local_58,(long *)params_3);
  local_b0 = (undefined1  [16])toCharSequence<char_const(&)[2]>((char (*) [2])params_4);
  toCharSequence<long_long>((CappedArray<char,_26UL> *)(local_90 + 0x10),(longlong *)params_5);
  StringTree::
  concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(StringTree *)local_c8,(CappedArray<char,_14UL> *)local_90,
             (ArrayPtr<const_char> *)&local_e0,(CappedArray<char,_14UL> *)local_a0,
             (ArrayPtr<const_char> *)&local_58,(CappedArray<char,_26UL> *)local_b0,
             (ArrayPtr<const_char> *)(local_90 + 0x10),in_stack_ffffffffffffff18);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}